

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  Descriptor *extendee;
  FieldDescriptor *pFVar1;
  
  extendee = DescriptorPool::FindMessageTypeByName(this->pool_,containing_type);
  if ((extendee != (Descriptor *)0x0) &&
     (pFVar1 = DescriptorPool::FindExtensionByNumber(this->pool_,extendee,field_number),
     pFVar1 != (FieldDescriptor *)0x0)) {
    (*(output->super_Message).super_MessageLite._vptr_MessageLite[4])(output);
    FileDescriptor::CopyTo(*(FileDescriptor **)(pFVar1 + 0x20),output);
    return true;
  }
  return false;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == NULL) return false;

  const FieldDescriptor* extension =
    pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == NULL) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  return true;
}